

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O0

ostream * mjs::operator<<(ostream *os,string *s)

{
  wchar_t *__beg;
  wchar_t *__end;
  ostream *poVar1;
  allocator<char> local_49;
  string local_48 [32];
  undefined1 local_28 [8];
  wstring_view v;
  string *s_local;
  ostream *os_local;
  
  v._M_str = (wchar_t *)s;
  _local_28 = string::view(s);
  __beg = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::begin
                    ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)local_28);
  __end = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::end
                    ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)local_28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<wchar_t_const*,void>(local_48,__beg,__end,&local_49);
  poVar1 = std::operator<<(os,local_48);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator(&local_49);
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const string& s) {
    auto v = s.view();
    return os << std::string(v.begin(), v.end());
}